

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int get_seek_page_info(stb_vorbis *f,ProbedPage *z)

{
  uint uVar1;
  uint *in_RSI;
  int len;
  int i;
  uint8 lacing [255];
  uint8 header [27];
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int iVar2;
  undefined4 in_stack_fffffffffffffec4;
  int iVar3;
  vorb *in_stack_fffffffffffffec8;
  char local_38;
  char local_37;
  char local_36;
  char local_35;
  byte local_32;
  byte local_31;
  byte local_30;
  byte local_2f;
  byte local_1e;
  int local_4;
  
  uVar1 = stb_vorbis_get_file_offset
                    ((stb_vorbis *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  *in_RSI = uVar1;
  getn(in_stack_fffffffffffffec8,
       (uint8 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
       in_stack_fffffffffffffebc);
  if ((((local_38 == 'O') && (local_37 == 'g')) && (local_36 == 'g')) && (local_35 == 'S')) {
    getn(in_stack_fffffffffffffec8,
         (uint8 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
         in_stack_fffffffffffffebc);
    iVar2 = 0;
    for (iVar3 = 0; iVar3 < (int)(uint)local_1e; iVar3 = iVar3 + 1) {
      iVar2 = (uint)(byte)(&stack0xfffffffffffffec8)[iVar3] + iVar2;
    }
    in_RSI[1] = *in_RSI + 0x1b + (uint)local_1e + iVar2;
    in_RSI[2] = (uint)local_32 + (uint)local_31 * 0x100 + (uint)local_30 * 0x10000 +
                (uint)local_2f * 0x1000000;
    set_file_offset((stb_vorbis *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int get_seek_page_info(stb_vorbis *f, ProbedPage *z)
{
   uint8 header[27], lacing[255];
   int i,len;

   // record where the page starts
   z->page_start = stb_vorbis_get_file_offset(f);

   // parse the header
   getn(f, header, 27);
   if (header[0] != 'O' || header[1] != 'g' || header[2] != 'g' || header[3] != 'S')
      return 0;
   getn(f, lacing, header[26]);

   // determine the length of the payload
   len = 0;
   for (i=0; i < header[26]; ++i)
      len += lacing[i];

   // this implies where the page ends
   z->page_end = z->page_start + 27 + header[26] + len;

   // read the last-decoded sample out of the data
   z->last_decoded_sample = header[6] + (header[7] << 8) + (header[8] << 16) + (header[9] << 24);

   // restore file state to where we were
   set_file_offset(f, z->page_start);
   return 1;
}